

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

string * __thiscall
argstest::Group::GetErrorMsg_abi_cxx11_(string *__return_storage_ptr__,Group *this)

{
  bool bVar1;
  vector<argstest::Base_*,_std::allocator<argstest::Base_*>_> *pvVar2;
  reference ppBVar3;
  allocator local_41;
  __normal_iterator<argstest::Base_*const_*,_std::vector<argstest::Base_*,_std::allocator<argstest::Base_*>_>_>
  local_40 [2];
  Base **local_30;
  Base **local_28;
  __normal_iterator<argstest::Base_*const_*,_std::vector<argstest::Base_*,_std::allocator<argstest::Base_*>_>_>
  local_20;
  __normal_iterator<argstest::Base_*const_*,_std::vector<argstest::Base_*,_std::allocator<argstest::Base_*>_>_>
  it;
  Group *this_local;
  
  it._M_current = (Base **)this;
  if ((this->super_Base).error == None) {
    pvVar2 = Children(this);
    local_28 = (Base **)std::vector<argstest::Base_*,_std::allocator<argstest::Base_*>_>::begin
                                  (pvVar2);
    pvVar2 = Children(this);
    local_30 = (Base **)std::vector<argstest::Base_*,_std::allocator<argstest::Base_*>_>::end
                                  (pvVar2);
    local_20 = std::
               find_if<__gnu_cxx::__normal_iterator<argstest::Base*const*,std::vector<argstest::Base*,std::allocator<argstest::Base*>>>,argstest::Group::GetErrorMsg[abi:cxx11]()const::_lambda(argstest::Base_const*)_1_>
                         (local_28,local_30);
    pvVar2 = Children(this);
    local_40[0]._M_current =
         (Base **)std::vector<argstest::Base_*,_std::allocator<argstest::Base_*>_>::end(pvVar2);
    bVar1 = __gnu_cxx::operator==(&local_20,local_40);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_41);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    else {
      ppBVar3 = __gnu_cxx::
                __normal_iterator<argstest::Base_*const_*,_std::vector<argstest::Base_*,_std::allocator<argstest::Base_*>_>_>
                ::operator*(&local_20);
      (*(*ppBVar3)->_vptr_Base[0x10])(__return_storage_ptr__);
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&(this->super_Base).errorMsg);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string GetErrorMsg() const override
            {
                if (error != Error::None)
                {
                    return errorMsg;
                }

                auto it = std::find_if(Children().begin(), Children().end(), [](const Base *child){return child->GetError() != Error::None;});
                if (it == Children().end())
                {
                    return "";
                } else
                {
                    return (*it)->GetErrorMsg();
                }
            }